

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O0

string * __thiscall
flatbuffers::swift::SwiftGenerator::GenReaderMainBody
          (string *__return_storage_ptr__,SwiftGenerator *this,string *optional)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *optional_local;
  SwiftGenerator *this_local;
  
  local_20 = optional;
  optional_local = (string *)this;
  this_local = (SwiftGenerator *)__return_storage_ptr__;
  std::operator+(&local_40,"{{ACCESS_TYPE}} var {{FIELDVAR}}: {{VALUETYPE}}",optional);
  std::operator+(__return_storage_ptr__,&local_40," { ");
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string GenReaderMainBody(const std::string &optional = "") {
    return "{{ACCESS_TYPE}} var {{FIELDVAR}}: {{VALUETYPE}}" + optional + " { ";
  }